

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_decode_partial_1_parallel
               (OPJ_INT32 *a,OPJ_UINT32 nb_cols,OPJ_INT32 dn,OPJ_INT32 sn,OPJ_INT32 cas,
               OPJ_INT32 win_l_x0,OPJ_INT32 win_l_x1,OPJ_INT32 win_h_x0,OPJ_INT32 win_h_x1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  longlong lVar8;
  OPJ_INT32 OVar9;
  OPJ_INT32 OVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  OPJ_INT32 local_430;
  OPJ_INT32 local_42c;
  OPJ_INT32 local_424;
  OPJ_INT32 local_420;
  OPJ_INT32 local_418;
  OPJ_INT32 local_414;
  OPJ_INT32 local_40c;
  OPJ_INT32 local_408;
  OPJ_INT32 local_3f4;
  OPJ_INT32 local_3f0;
  OPJ_INT32 local_3e8;
  OPJ_INT32 local_3e4;
  OPJ_INT32 local_3e0;
  OPJ_INT32 local_3dc;
  OPJ_INT32 local_3d4;
  OPJ_INT32 local_3d0;
  OPJ_INT32 local_3cc;
  OPJ_INT32 local_3c8;
  OPJ_INT32 local_3c0;
  OPJ_INT32 local_3bc;
  __m128i S2;
  __m128i D1_1;
  __m128i S1_1;
  __m128i D_1;
  __m128i S_1;
  OPJ_INT32 local_35c;
  OPJ_INT32 i_max_1;
  __m128i D1;
  __m128i S1;
  __m128i D;
  __m128i S;
  __m128i Dm1;
  __m128i two;
  OPJ_INT32 local_2f0;
  uint local_2ec;
  OPJ_INT32 i_max;
  OPJ_UINT32 off;
  OPJ_INT32 i;
  OPJ_INT32 win_l_x0_local;
  OPJ_INT32 cas_local;
  OPJ_INT32 sn_local;
  OPJ_INT32 dn_local;
  OPJ_UINT32 nb_cols_local;
  OPJ_INT32 *a_local;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  
  if (cas == 0) {
    if ((0 < dn) || (1 < sn)) {
      if (win_l_x0 < win_l_x1) {
        for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
          if (win_l_x0 + -1 < 0) {
            local_3bc = a[local_2ec + 4];
          }
          else {
            if (win_l_x0 + -1 < dn) {
              local_3c0 = a[((win_l_x0 + -1) * 2 + 1) * 4 + local_2ec];
            }
            else {
              local_3c0 = a[((dn + -1) * 2 + 1) * 4 + local_2ec];
            }
            local_3bc = local_3c0;
          }
          if (win_l_x0 < 0) {
            local_3c8 = a[local_2ec + 4];
          }
          else {
            if (win_l_x0 < dn) {
              local_3cc = a[(win_l_x0 * 2 + 1) * 4 + local_2ec];
            }
            else {
              local_3cc = a[((dn + -1) * 2 + 1) * 4 + local_2ec];
            }
            local_3c8 = local_3cc;
          }
          uVar11 = win_l_x0 * 8 + local_2ec;
          a[uVar11] = a[uVar11] - (local_3bc + local_3c8 + 2 >> 2);
        }
        i_max = win_l_x0 + 1;
        local_2f0 = win_l_x1;
        if (dn < win_l_x1) {
          local_2f0 = dn;
        }
        if (win_l_x0 + 2 < local_2f0) {
          S[1] = *(longlong *)(a + (long)(win_l_x0 * 8) + 4);
          Dm1[0] = *(longlong *)((long)(a + (long)(win_l_x0 * 8) + 4) + 8);
          for (; i_max + 1 < local_2f0; i_max = i_max + 2) {
            uVar1 = *(undefined8 *)(a + (i_max << 3));
            uVar2 = *(undefined8 *)(a + (i_max << 3) + 2);
            uVar3 = *(undefined8 *)(a + (long)(i_max << 3) + 4);
            uVar4 = *(undefined8 *)(a + (long)(i_max << 3) + 4 + 2);
            uVar5 = *(undefined8 *)(a + (i_max + 1) * 8);
            uVar6 = *(undefined8 *)(a + (i_max + 1) * 8 + 2);
            lVar7 = *(longlong *)(a + (long)((i_max + 1) * 8) + 4);
            lVar8 = *(longlong *)((long)(a + (long)((i_max + 1) * 8) + 4) + 8);
            local_118 = (int)S[1];
            iStack_114 = (int)((ulong)S[1] >> 0x20);
            iStack_110 = (int)Dm1[0];
            iStack_10c = (int)((ulong)Dm1[0] >> 0x20);
            local_128 = (int)uVar3;
            iStack_124 = (int)((ulong)uVar3 >> 0x20);
            iStack_120 = (int)uVar4;
            iStack_11c = (int)((ulong)uVar4 >> 0x20);
            auVar12 = ZEXT416(2);
            local_298 = (int)uVar1;
            iStack_294 = (int)((ulong)uVar1 >> 0x20);
            iStack_290 = (int)uVar2;
            iStack_28c = (int)((ulong)uVar2 >> 0x20);
            D[1] = CONCAT44(iStack_294 - (iStack_114 + iStack_124 + 2 >> auVar12),
                            local_298 - (local_118 + local_128 + 2 >> auVar12));
            S[0] = CONCAT44(iStack_28c - (iStack_10c + iStack_11c + 2 >> auVar12),
                            iStack_290 - (iStack_110 + iStack_120 + 2 >> auVar12));
            local_168 = (int)lVar7;
            iStack_164 = (int)((ulong)lVar7 >> 0x20);
            iStack_160 = (int)lVar8;
            iStack_15c = (int)((ulong)lVar8 >> 0x20);
            auVar12 = ZEXT416(2);
            local_2b8 = (int)uVar5;
            iStack_2b4 = (int)((ulong)uVar5 >> 0x20);
            iStack_2b0 = (int)uVar6;
            iStack_2ac = (int)((ulong)uVar6 >> 0x20);
            D1[1] = CONCAT44(iStack_2b4 - (iStack_124 + iStack_164 + 2 >> auVar12),
                             local_2b8 - (local_128 + local_168 + 2 >> auVar12));
            S1[0] = CONCAT44(iStack_2ac - (iStack_11c + iStack_15c + 2 >> auVar12),
                             iStack_2b0 - (iStack_120 + iStack_160 + 2 >> auVar12));
            *(longlong *)(a + (i_max << 3)) = D[1];
            *(longlong *)((long)(a + (i_max << 3)) + 8) = S[0];
            *(longlong *)(a + (i_max + 1) * 8) = D1[1];
            *(longlong *)((long)(a + (i_max + 1) * 8) + 8) = S1[0];
            S[1] = lVar7;
            Dm1[0] = lVar8;
          }
        }
        for (; i_max < local_2f0; i_max = i_max + 1) {
          for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
            uVar11 = i_max * 8 + local_2ec;
            a[uVar11] = a[uVar11] -
                        (a[((i_max + -1) * 2 + 1) * 4 + local_2ec] +
                         a[(i_max * 2 + 1) * 4 + local_2ec] + 2 >> 2);
          }
        }
        for (; i_max < win_l_x1; i_max = i_max + 1) {
          for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
            if (i_max + -1 < 0) {
              local_3d0 = a[local_2ec + 4];
            }
            else {
              if (i_max + -1 < dn) {
                local_3d4 = a[((i_max + -1) * 2 + 1) * 4 + local_2ec];
              }
              else {
                local_3d4 = a[((dn + -1) * 2 + 1) * 4 + local_2ec];
              }
              local_3d0 = local_3d4;
            }
            if (i_max < 0) {
              local_3dc = a[local_2ec + 4];
            }
            else {
              if (i_max < dn) {
                local_3e0 = a[(i_max * 2 + 1) * 4 + local_2ec];
              }
              else {
                local_3e0 = a[((dn + -1) * 2 + 1) * 4 + local_2ec];
              }
              local_3dc = local_3e0;
            }
            uVar11 = i_max * 8 + local_2ec;
            a[uVar11] = a[uVar11] - (local_3d0 + local_3dc + 2 >> 2);
          }
        }
      }
      i_max = win_h_x0;
      if (win_h_x0 < win_h_x1) {
        local_35c = win_h_x1;
        if (sn <= win_h_x1) {
          local_35c = sn + -1;
        }
        if (win_h_x0 + 1 < local_35c) {
          D_1[1] = *(longlong *)(a + (win_h_x0 << 3));
          S_1[0] = *(longlong *)((long)(a + (win_h_x0 << 3)) + 8);
          for (; i_max + 1 < local_35c; i_max = i_max + 2) {
            uVar1 = *(undefined8 *)(a + (long)(i_max << 3) + 4);
            uVar2 = *(undefined8 *)(a + (long)(i_max << 3) + 4 + 2);
            uVar3 = *(undefined8 *)(a + (i_max + 1) * 8);
            uVar4 = *(undefined8 *)(a + (i_max + 1) * 8 + 2);
            uVar5 = *(undefined8 *)(a + (long)((i_max + 1) * 8) + 4);
            uVar6 = *(undefined8 *)(a + (long)((i_max + 1) * 8) + 4 + 2);
            lVar7 = *(longlong *)(a + (i_max + 2) * 8);
            lVar8 = *(longlong *)((long)(a + (i_max + 2) * 8) + 8);
            local_198 = (int)D_1[1];
            iStack_194 = (int)((ulong)D_1[1] >> 0x20);
            iStack_190 = (int)S_1[0];
            iStack_18c = (int)((ulong)S_1[0] >> 0x20);
            local_1a8 = (int)uVar3;
            iStack_1a4 = (int)((ulong)uVar3 >> 0x20);
            iStack_1a0 = (int)uVar4;
            iStack_19c = (int)((ulong)uVar4 >> 0x20);
            auVar12 = ZEXT416(1);
            local_1b8 = (int)uVar1;
            iStack_1b4 = (int)((ulong)uVar1 >> 0x20);
            iStack_1b0 = (int)uVar2;
            iStack_1ac = (int)((ulong)uVar2 >> 0x20);
            S1_1[1] = CONCAT44(iStack_1b4 + (iStack_194 + iStack_1a4 >> auVar12),
                               local_1b8 + (local_198 + local_1a8 >> auVar12));
            D_1[0] = CONCAT44(iStack_1ac + (iStack_18c + iStack_19c >> auVar12),
                              iStack_1b0 + (iStack_190 + iStack_1a0 >> auVar12));
            local_1e8 = (int)lVar7;
            iStack_1e4 = (int)((ulong)lVar7 >> 0x20);
            iStack_1e0 = (int)lVar8;
            iStack_1dc = (int)((ulong)lVar8 >> 0x20);
            auVar12 = ZEXT416(1);
            local_1f8 = (int)uVar5;
            iStack_1f4 = (int)((ulong)uVar5 >> 0x20);
            iStack_1f0 = (int)uVar6;
            iStack_1ec = (int)((ulong)uVar6 >> 0x20);
            S2[1] = CONCAT44(iStack_1f4 + (iStack_1a4 + iStack_1e4 >> auVar12),
                             local_1f8 + (local_1a8 + local_1e8 >> auVar12));
            D1_1[0] = CONCAT44(iStack_1ec + (iStack_19c + iStack_1dc >> auVar12),
                               iStack_1f0 + (iStack_1a0 + iStack_1e0 >> auVar12));
            *(longlong *)(a + (long)(i_max << 3) + 4) = S1_1[1];
            *(longlong *)((long)(a + (long)(i_max << 3) + 4) + 8) = D_1[0];
            *(longlong *)(a + (long)((i_max + 1) * 8) + 4) = S2[1];
            *(longlong *)((long)(a + (long)((i_max + 1) * 8) + 4) + 8) = D1_1[0];
            D_1[1] = lVar7;
            S_1[0] = lVar8;
          }
        }
        for (; i_max < local_35c; i_max = i_max + 1) {
          for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
            uVar11 = (i_max * 2 + 1) * 4 + local_2ec;
            a[uVar11] = (a[i_max * 8 + local_2ec] + a[(i_max + 1) * 8 + local_2ec] >> 1) + a[uVar11]
            ;
          }
        }
        for (; i_max < win_h_x1; i_max = i_max + 1) {
          for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
            if (i_max < 0) {
              local_3e4 = a[local_2ec];
            }
            else {
              if (i_max < sn) {
                local_3e8 = a[i_max * 8 + local_2ec];
              }
              else {
                local_3e8 = a[(sn + -1) * 8 + local_2ec];
              }
              local_3e4 = local_3e8;
            }
            if (i_max + 1 < 0) {
              local_3f0 = a[local_2ec];
            }
            else {
              if (i_max + 1 < sn) {
                local_3f4 = a[(i_max + 1) * 8 + local_2ec];
              }
              else {
                local_3f4 = a[(sn + -1) * 8 + local_2ec];
              }
              local_3f0 = local_3f4;
            }
            uVar11 = (i_max * 2 + 1) * 4 + local_2ec;
            a[uVar11] = (local_3e4 + local_3f0 >> 1) + a[uVar11];
          }
        }
      }
    }
  }
  else {
    i_max = win_l_x0;
    if ((sn == 0) && (dn == 1)) {
      for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
        a[local_2ec] = a[local_2ec] / 2;
      }
    }
    else {
      for (; i_max < win_l_x1; i_max = i_max + 1) {
        for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
          OVar10 = a[(i_max * 2 + 1) * 4 + local_2ec];
          if (i_max < 0) {
            local_408 = a[local_2ec];
          }
          else {
            if (i_max < dn) {
              local_40c = a[i_max * 8 + local_2ec];
            }
            else {
              local_40c = a[(dn + -1) * 8 + local_2ec];
            }
            local_408 = local_40c;
          }
          if (i_max + 1 < 0) {
            local_414 = a[local_2ec];
          }
          else {
            if (i_max + 1 < dn) {
              local_418 = a[(i_max + 1) * 8 + local_2ec];
            }
            else {
              local_418 = a[(dn + -1) * 8 + local_2ec];
            }
            local_414 = local_418;
          }
          OVar9 = opj_int_add_no_overflow(local_408,local_414);
          OVar9 = opj_int_add_no_overflow(OVar9,2);
          OVar10 = opj_int_sub_no_overflow(OVar10,OVar9 >> 2);
          a[(i_max * 2 + 1) * 4 + local_2ec] = OVar10;
        }
      }
      for (i_max = win_h_x0; i_max < win_h_x1; i_max = i_max + 1) {
        for (local_2ec = 0; local_2ec < 4; local_2ec = local_2ec + 1) {
          OVar10 = a[i_max * 8 + local_2ec];
          if (i_max < 0) {
            local_420 = a[local_2ec + 4];
          }
          else {
            if (i_max < sn) {
              local_424 = a[(i_max * 2 + 1) * 4 + local_2ec];
            }
            else {
              local_424 = a[((sn + -1) * 2 + 1) * 4 + local_2ec];
            }
            local_420 = local_424;
          }
          if (i_max + -1 < 0) {
            local_42c = a[local_2ec + 4];
          }
          else {
            if (i_max + -1 < sn) {
              local_430 = a[((i_max + -1) * 2 + 1) * 4 + local_2ec];
            }
            else {
              local_430 = a[((sn + -1) * 2 + 1) * 4 + local_2ec];
            }
            local_42c = local_430;
          }
          OVar9 = opj_int_add_no_overflow(local_420,local_42c);
          OVar10 = opj_int_add_no_overflow(OVar10,OVar9 >> 1);
          a[i_max * 8 + local_2ec] = OVar10;
        }
      }
    }
  }
  return;
}

Assistant:

static void opj_dwt_decode_partial_1_parallel(OPJ_INT32 *a,
        OPJ_UINT32 nb_cols,
        OPJ_INT32 dn, OPJ_INT32 sn,
        OPJ_INT32 cas,
        OPJ_INT32 win_l_x0,
        OPJ_INT32 win_l_x1,
        OPJ_INT32 win_h_x0,
        OPJ_INT32 win_h_x1)
{
    OPJ_INT32 i;
    OPJ_UINT32 off;

    (void)nb_cols;

    if (!cas) {
        if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */

            /* Naive version is :
            for (i = win_l_x0; i < i_max; i++) {
                OPJ_S(i) -= (OPJ_D_(i - 1) + OPJ_D_(i) + 2) >> 2;
            }
            for (i = win_h_x0; i < win_h_x1; i++) {
                OPJ_D(i) += (OPJ_S_(i) + OPJ_S_(i + 1)) >> 1;
            }
            but the compiler doesn't manage to unroll it to avoid bound
            checking in OPJ_S_ and OPJ_D_ macros
            */

            i = win_l_x0;
            if (i < win_l_x1) {
                OPJ_INT32 i_max;

                /* Left-most case */
                for (off = 0; off < 4; off++) {
                    OPJ_S_off(i, off) -= (OPJ_D__off(i - 1, off) + OPJ_D__off(i, off) + 2) >> 2;
                }
                i ++;

                i_max = win_l_x1;
                if (i_max > dn) {
                    i_max = dn;
                }

#ifdef __SSE2__
                if (i + 1 < i_max) {
                    const __m128i two = _mm_set1_epi32(2);
                    __m128i Dm1 = _mm_load_si128((__m128i * const)(a + 4 + (i - 1) * 8));
                    for (; i + 1 < i_max; i += 2) {
                        /* No bound checking */
                        __m128i S = _mm_load_si128((__m128i * const)(a + i * 8));
                        __m128i D = _mm_load_si128((__m128i * const)(a + 4 + i * 8));
                        __m128i S1 = _mm_load_si128((__m128i * const)(a + (i + 1) * 8));
                        __m128i D1 = _mm_load_si128((__m128i * const)(a + 4 + (i + 1) * 8));
                        S = _mm_sub_epi32(S,
                                          _mm_srai_epi32(_mm_add_epi32(_mm_add_epi32(Dm1, D), two), 2));
                        S1 = _mm_sub_epi32(S1,
                                           _mm_srai_epi32(_mm_add_epi32(_mm_add_epi32(D, D1), two), 2));
                        _mm_store_si128((__m128i*)(a + i * 8), S);
                        _mm_store_si128((__m128i*)(a + (i + 1) * 8), S1);
                        Dm1 = D1;
                    }
                }
#endif

                for (; i < i_max; i++) {
                    /* No bound checking */
                    for (off = 0; off < 4; off++) {
                        OPJ_S_off(i, off) -= (OPJ_D_off(i - 1, off) + OPJ_D_off(i, off) + 2) >> 2;
                    }
                }
                for (; i < win_l_x1; i++) {
                    /* Right-most case */
                    for (off = 0; off < 4; off++) {
                        OPJ_S_off(i, off) -= (OPJ_D__off(i - 1, off) + OPJ_D__off(i, off) + 2) >> 2;
                    }
                }
            }

            i = win_h_x0;
            if (i < win_h_x1) {
                OPJ_INT32 i_max = win_h_x1;
                if (i_max >= sn) {
                    i_max = sn - 1;
                }

#ifdef __SSE2__
                if (i + 1 < i_max) {
                    __m128i S =  _mm_load_si128((__m128i * const)(a + i * 8));
                    for (; i + 1 < i_max; i += 2) {
                        /* No bound checking */
                        __m128i D = _mm_load_si128((__m128i * const)(a + 4 + i * 8));
                        __m128i S1 = _mm_load_si128((__m128i * const)(a + (i + 1) * 8));
                        __m128i D1 = _mm_load_si128((__m128i * const)(a + 4 + (i + 1) * 8));
                        __m128i S2 = _mm_load_si128((__m128i * const)(a + (i + 2) * 8));
                        D = _mm_add_epi32(D, _mm_srai_epi32(_mm_add_epi32(S, S1), 1));
                        D1 = _mm_add_epi32(D1, _mm_srai_epi32(_mm_add_epi32(S1, S2), 1));
                        _mm_store_si128((__m128i*)(a + 4 + i * 8), D);
                        _mm_store_si128((__m128i*)(a + 4 + (i + 1) * 8), D1);
                        S = S2;
                    }
                }
#endif

                for (; i < i_max; i++) {
                    /* No bound checking */
                    for (off = 0; off < 4; off++) {
                        OPJ_D_off(i, off) += (OPJ_S_off(i, off) + OPJ_S_off(i + 1, off)) >> 1;
                    }
                }
                for (; i < win_h_x1; i++) {
                    /* Right-most case */
                    for (off = 0; off < 4; off++) {
                        OPJ_D_off(i, off) += (OPJ_S__off(i, off) + OPJ_S__off(i + 1, off)) >> 1;
                    }
                }
            }
        }
    } else {
        if (!sn  && dn == 1) {        /* NEW :  CASE ONE ELEMENT */
            for (off = 0; off < 4; off++) {
                OPJ_S_off(0, off) /= 2;
            }
        } else {
            for (i = win_l_x0; i < win_l_x1; i++) {
                for (off = 0; off < 4; off++) {
                    OPJ_D_off(i, off) = opj_int_sub_no_overflow(
                                            OPJ_D_off(i, off),
                                            opj_int_add_no_overflow(
                                                opj_int_add_no_overflow(OPJ_SS__off(i, off), OPJ_SS__off(i + 1, off)), 2) >> 2);
                }
            }
            for (i = win_h_x0; i < win_h_x1; i++) {
                for (off = 0; off < 4; off++) {
                    OPJ_S_off(i, off) = opj_int_add_no_overflow(
                                            OPJ_S_off(i, off),
                                            opj_int_add_no_overflow(OPJ_DD__off(i, off), OPJ_DD__off(i - 1, off)) >> 1);
                }
            }
        }
    }
}